

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Constellation(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CAMFImporter_NodeElement *this_00;
  ulong uVar5;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  byte local_81;
  CAMFImporter_NodeElement *pCStack_80;
  bool close_found;
  CAMFImporter_NodeElement_Constellation *als;
  undefined1 local_70 [8];
  string an;
  uint local_3c;
  int idx_end;
  int idx;
  CAMFImporter_NodeElement *ne;
  string id;
  AMFImporter *this_local;
  
  id.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)&ne);
  _idx_end = (value_type)0x0;
  local_3c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_3c < iVar2; local_3c = local_3c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_3c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,(char *)CONCAT44(extraout_var,iVar3),
               (allocator<char> *)((long)&als + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&als + 7));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_70,"id");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_3c);
      std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_00,iVar3));
      als._0_4_ = 4;
    }
    else {
      Throw_IncorrectAttr(this,(string *)local_70);
      als._0_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  this_00 = (CAMFImporter_NodeElement *)operator_new(0x50);
  CAMFImporter_NodeElement_Constellation::CAMFImporter_NodeElement_Constellation
            ((CAMFImporter_NodeElement_Constellation *)this_00,this->mNodeElement_Cur);
  pCStack_80 = this_00;
  _idx_end = this_00;
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&pCStack_80->ID,(string *)&ne);
  }
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    ParseHelper_Node_Enter(this,_idx_end);
    local_81 = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_005dfc92;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_a8,"instance",&local_a9);
          bVar1 = XML_CheckNode_NameEqual(this,&local_a8);
          std::__cxx11::string::~string((string *)&local_a8);
          std::allocator<char>::~allocator(&local_a9);
          if (bVar1) {
            ParseNode_Instance(this);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d0,"metadata",&local_d1);
            bVar1 = XML_CheckNode_NameEqual(this,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
            std::allocator<char>::~allocator(&local_d1);
            if (bVar1) {
              ParseNode_Metadata(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_f8,"constellation",&local_f9);
              XML_CheckNode_SkipUnsupported(this,&local_f8);
              std::__cxx11::string::~string((string *)&local_f8);
              std::allocator<char>::~allocator(&local_f9);
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"constellation",&local_121);
      bVar1 = XML_CheckNode_NameEqual(this,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator(&local_121);
    } while (!bVar1);
    local_81 = 1;
LAB_005dfc92:
    if ((local_81 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"constellation",&local_149);
      Throw_CloseNotFound(this,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
    }
    ParseHelper_Node_Exit(this);
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,(value_type *)&idx_end);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&idx_end);
  std::__cxx11::string::~string((string *)&ne);
  return;
}

Assistant:

void AMFImporter::ParseNode_Constellation()
{
    std::string id;
    CAMFImporter_NodeElement* ne( nullptr );

	// Read attributes for node <constellation>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("id", id, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create and if needed - define new grouping object.
	ne = new CAMFImporter_NodeElement_Constellation(mNodeElement_Cur);

	CAMFImporter_NodeElement_Constellation& als = *((CAMFImporter_NodeElement_Constellation*)ne);// alias for convenience

	if(!id.empty()) als.ID = id;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("constellation");
			if(XML_CheckNode_NameEqual("instance")) { ParseNode_Instance(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("constellation");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}